

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.h
# Opt level: O0

void __thiscall cnn::Timer::~Timer(Timer *this)

{
  ostream *poVar1;
  type __d;
  string *in_RDI;
  rep rVar2;
  time_point stop;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffb0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffb8;
  duration<double,_std::ratio<1L,_1000L>_> local_18;
  undefined8 local_10;
  
  local_10 = std::chrono::_V2::system_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cerr,'[');
  poVar1 = std::operator<<(poVar1,in_RDI);
  poVar1 = std::operator<<(poVar1,' ');
  __d = std::chrono::operator-(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::chrono::duration<double,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1000L>_> *)poVar1,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)__d.__r);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_18);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," ms]\n");
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

~Timer() {
    auto stop = std::chrono::high_resolution_clock::now();
    std::cerr << '[' << msg << ' ' << std::chrono::duration<double, std::milli>(stop-start).count() << " ms]\n";
  }